

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O0

HomogeneousMedium *
pbrt::HomogeneousMedium::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  Allocator alloc_00;
  Allocator alloc_01;
  Allocator alloc_02;
  bool bVar1;
  ulong uVar2;
  HomogeneousMedium *pHVar3;
  undefined8 in_RDX;
  allocator<char> *in_RDI;
  Float FVar4;
  Float FVar5;
  Float FVar6;
  Float g;
  Float sigmaScale;
  Float LeScale;
  Spectrum Le;
  string preset;
  Spectrum sig_s;
  Spectrum sig_a;
  string *in_stack_fffffffffffffcd8;
  ParameterDictionary *in_stack_fffffffffffffce0;
  float *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  Spectrum *args_3;
  undefined4 in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  allocator<char> *paVar7;
  Spectrum *in_stack_fffffffffffffd18;
  Spectrum *args;
  undefined4 in_stack_fffffffffffffd20;
  Float in_stack_fffffffffffffd24;
  Allocator in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  Float in_stack_fffffffffffffd34;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffd3c;
  undefined8 in_stack_fffffffffffffd48;
  SpectrumType spectrumType;
  Spectrum *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  string *name;
  ParameterDictionary *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  undefined8 local_229;
  Float local_208;
  undefined8 local_201;
  Float local_1dc;
  undefined4 local_1cc;
  allocator<char> local_1b9;
  string local_1b8 [36];
  Float local_194;
  undefined8 local_190;
  undefined1 local_179 [33];
  TaggedPointer local_158 [12];
  undefined4 local_14c;
  undefined8 local_140;
  allocator<char> local_129;
  string local_128 [44];
  undefined4 local_fc;
  undefined8 local_f0;
  allocator<char> local_d9;
  string local_d8 [40];
  undefined8 local_b0;
  allocator<char> local_a1;
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [32];
  string local_48 [32];
  TaggedPointer local_28 [8];
  TaggedPointer local_20 [16];
  allocator<char> *local_10;
  undefined8 local_8;
  
  spectrumType = (SpectrumType)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  local_10 = in_RDI;
  local_8 = in_RDX;
  Spectrum::TaggedPointer((Spectrum *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  Spectrum::TaggedPointer((Spectrum *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             (char *)in_stack_fffffffffffffd18,(allocator<char> *)in_stack_fffffffffffffd10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             (char *)in_stack_fffffffffffffd18,(allocator<char> *)in_stack_fffffffffffffd10);
  ParameterDictionary::GetOneString
            ((ParameterDictionary *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (string *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
             (string *)in_stack_fffffffffffffd28.memoryResource);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_b0 = local_8;
    bVar1 = GetMediumScatteringProperties
                      ((string *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                       in_stack_fffffffffffffd18,(Spectrum *)in_stack_fffffffffffffd10,
                       in_stack_fffffffffffffd28);
    if (!bVar1) {
      Warning<std::__cxx11::string&>
                ((FileLoc *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                 (char *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    }
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_20);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               (char *)in_stack_fffffffffffffd18,(allocator<char> *)in_stack_fffffffffffffd10);
    Spectrum::TaggedPointer((Spectrum *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    local_f0 = local_8;
    alloc_00.memoryResource._7_1_ = in_stack_fffffffffffffd6f;
    alloc_00.memoryResource._0_7_ = in_stack_fffffffffffffd68;
    ParameterDictionary::GetOneSpectrum
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
               spectrumType,alloc_00);
    Spectrum::operator=((Spectrum *)in_stack_fffffffffffffce0,(Spectrum *)in_stack_fffffffffffffcd8)
    ;
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator(&local_d9);
    bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_20);
    if (!bVar1) {
      local_fc = 0x3f800000;
      pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float>
                ((polymorphic_allocator<std::byte> *)
                 CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                 in_stack_fffffffffffffce8);
      Spectrum::TaggedPointer<pbrt::ConstantSpectrum>
                ((Spectrum *)in_stack_fffffffffffffce0,(ConstantSpectrum *)in_stack_fffffffffffffcd8
                );
      Spectrum::operator=((Spectrum *)in_stack_fffffffffffffce0,
                          (Spectrum *)in_stack_fffffffffffffcd8);
    }
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_28);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               (char *)in_stack_fffffffffffffd18,(allocator<char> *)in_stack_fffffffffffffd10);
    Spectrum::TaggedPointer((Spectrum *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    local_140 = local_8;
    alloc_01.memoryResource._7_1_ = in_stack_fffffffffffffd6f;
    alloc_01.memoryResource._0_7_ = in_stack_fffffffffffffd68;
    ParameterDictionary::GetOneSpectrum
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
               spectrumType,alloc_01);
    Spectrum::operator=((Spectrum *)in_stack_fffffffffffffce0,(Spectrum *)in_stack_fffffffffffffcd8)
    ;
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator(&local_129);
    in_stack_fffffffffffffd6f = pbrt::TaggedPointer::operator_cast_to_bool(local_28);
    if (!(bool)in_stack_fffffffffffffd6f) {
      local_14c = 0x3f800000;
      in_stack_fffffffffffffd60 =
           (ParameterDictionary *)
           pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float>
                     ((polymorphic_allocator<std::byte> *)
                      CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                      in_stack_fffffffffffffce8);
      Spectrum::TaggedPointer<pbrt::ConstantSpectrum>
                ((Spectrum *)in_stack_fffffffffffffce0,(ConstantSpectrum *)in_stack_fffffffffffffcd8
                );
      Spectrum::operator=((Spectrum *)in_stack_fffffffffffffce0,
                          (Spectrum *)in_stack_fffffffffffffcd8);
    }
  }
  name = (string *)local_179;
  paVar7 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             (char *)in_stack_fffffffffffffd18,(allocator<char> *)in_stack_fffffffffffffd10);
  Spectrum::TaggedPointer((Spectrum *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  local_190 = local_8;
  alloc_02.memoryResource._7_1_ = in_stack_fffffffffffffd6f;
  alloc_02.memoryResource._0_7_ = in_stack_fffffffffffffd68;
  ParameterDictionary::GetOneSpectrum
            (in_stack_fffffffffffffd60,name,(Spectrum *)paVar7,spectrumType,alloc_02);
  std::__cxx11::string::~string((string *)(local_179 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             (char *)in_stack_fffffffffffffd18,(allocator<char> *)in_stack_fffffffffffffd10);
  FVar4 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,0.0);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  local_194 = FVar4;
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_158);
  uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd38);
  if (bVar1) {
    in_stack_fffffffffffffd34 = Spectrum::MaxValue((Spectrum *)in_stack_fffffffffffffce0);
    if ((in_stack_fffffffffffffd34 != 0.0) || (NAN(in_stack_fffffffffffffd34))) {
      Spectrum::Spectrum((Spectrum *)in_stack_fffffffffffffce0,(Spectrum *)in_stack_fffffffffffffcd8
                        );
      in_stack_fffffffffffffd24 =
           SpectrumToPhotometric
                     ((Spectrum *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
      local_194 = local_194 / in_stack_fffffffffffffd24;
      goto LAB_0090ab35;
    }
  }
  local_1cc = 0;
  pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float>
            ((polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),in_stack_fffffffffffffce8
            );
  Spectrum::TaggedPointer<pbrt::ConstantSpectrum>
            ((Spectrum *)in_stack_fffffffffffffce0,(ConstantSpectrum *)in_stack_fffffffffffffcd8);
  Spectrum::operator=((Spectrum *)in_stack_fffffffffffffce0,(Spectrum *)in_stack_fffffffffffffcd8);
LAB_0090ab35:
  args = (Spectrum *)&local_201;
  paVar7 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),(char *)args,paVar7);
  FVar5 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,0.0);
  std::__cxx11::string::~string((string *)((long)&local_201 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  args_3 = (Spectrum *)&local_229;
  local_1dc = FVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),(char *)args,paVar7);
  FVar6 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,0.0);
  std::__cxx11::string::~string((string *)((long)&local_229 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  local_208 = FVar6;
  pHVar3 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::HomogeneousMedium,pbrt::Spectrum&,pbrt::Spectrum&,float&,pbrt::Spectrum&,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     ((polymorphic_allocator<std::byte> *)
                      CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),args,
                      (Spectrum *)paVar7,(float *)CONCAT44(FVar5,in_stack_fffffffffffffd08),args_3,
                      (float *)local_10,
                      (float *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                      (polymorphic_allocator<std::byte> *)CONCAT44(FVar4,uVar8));
  std::__cxx11::string::~string(local_48);
  return pHVar3;
}

Assistant:

HomogeneousMedium *HomogeneousMedium::Create(const ParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    Spectrum sig_a = nullptr, sig_s = nullptr;
    std::string preset = parameters.GetOneString("preset", "");
    if (!preset.empty()) {
        if (!GetMediumScatteringProperties(preset, &sig_a, &sig_s, alloc))
            Warning(loc, "Material preset \"%s\" not found.", preset);
    }
    if (!sig_a) {
        sig_a =
            parameters.GetOneSpectrum("sigma_a", nullptr, SpectrumType::Unbounded, alloc);
        if (!sig_a)
            sig_a = alloc.new_object<ConstantSpectrum>(1.f);
    }
    if (!sig_s) {
        sig_s =
            parameters.GetOneSpectrum("sigma_s", nullptr, SpectrumType::Unbounded, alloc);
        if (!sig_s)
            sig_s = alloc.new_object<ConstantSpectrum>(1.f);
    }

    Spectrum Le =
        parameters.GetOneSpectrum("Le", nullptr, SpectrumType::Illuminant, alloc);
    Float LeScale = parameters.GetOneFloat("Lescale", 1.f);
    if (!Le || Le.MaxValue() == 0)
        Le = alloc.new_object<ConstantSpectrum>(0.f);
    else
        LeScale /= SpectrumToPhotometric(Le);

    Float sigmaScale = parameters.GetOneFloat("scale", 1.f);
    Float g = parameters.GetOneFloat("g", 0.0f);

    return alloc.new_object<HomogeneousMedium>(sig_a, sig_s, sigmaScale, Le, LeScale, g,
                                               alloc);
}